

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_26fab4::CpuZeropageIndexedTest_sbc_zero_x_Test::TestBody
          (CpuZeropageIndexedTest_sbc_zero_x_Test *this)

{
  (this->super_CpuZeropageIndexedTest).super_CpuTest.registers.a = 'P';
  (this->super_CpuZeropageIndexedTest).super_CpuTest.registers.p = 'A';
  (this->super_CpuZeropageIndexedTest).super_CpuTest.expected.p = '\x01';
  (this->super_CpuZeropageIndexedTest).super_CpuTest.expected.a = 'I';
  (this->super_CpuZeropageIndexedTest).super_CpuTest.field_0x114 = 7;
  CpuZeropageIndexedTest::run_read_instruction(&this->super_CpuZeropageIndexedTest,0xf5,X);
  return;
}

Assistant:

TEST_F(CpuZeropageIndexedTest, sbc_zero_x) {
    registers.a = 0x50;
    registers.p = V_FLAG | C_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x50 - 0x07;
    memory_content = 0x07;

    run_read_instruction(SBC_ZEROX, IndexReg::X);
}